

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

int calc_chunk(uint8_t *chunk,buffer_state *state)

{
  size_t sVar1;
  buffer_state *pbVar2;
  int local_3c;
  ulong uStack_38;
  int i;
  size_t len;
  size_t left;
  size_t space_in_chunk;
  buffer_state *state_local;
  uint8_t *chunk_local;
  
  if (state->total_len_delivered == 0) {
    if (state->len < 0x40) {
      memcpy(chunk,state->p,state->len);
      pbVar2 = (buffer_state *)(chunk + state->len);
      sVar1 = state->len;
      left = -sVar1 + 0x40;
      state->p = state->p + state->len;
      state->len = 0;
      state_local = pbVar2;
      if (state->single_one_delivered == 0) {
        state_local = (buffer_state *)((long)&pbVar2->p + 1);
        *(uint8_t *)&pbVar2->p = 0x80;
        left = -sVar1 + 0x3f;
        state->single_one_delivered = 1;
      }
      if (left < 8) {
        memset(state_local,0,left);
      }
      else {
        uStack_38 = state->total_len;
        memset(state_local,0,left - 8);
        *(char *)((long)state_local + (left - 1)) = (char)(uStack_38 << 3);
        uStack_38 = uStack_38 >> 5;
        for (local_3c = 6; -1 < local_3c; local_3c = local_3c + -1) {
          *(char *)((long)state_local + (long)local_3c + (left - 8)) = (char)uStack_38;
          uStack_38 = uStack_38 >> 8;
        }
        state->total_len_delivered = 1;
      }
      chunk_local._4_4_ = 1;
    }
    else {
      memcpy(chunk,state->p,0x40);
      state->p = state->p + 0x40;
      state->len = state->len - 0x40;
      chunk_local._4_4_ = 1;
    }
  }
  else {
    chunk_local._4_4_ = 0;
  }
  return chunk_local._4_4_;
}

Assistant:

static int calc_chunk(uint8_t chunk[CHUNK_SIZE], struct buffer_state * state)
{
   size_t space_in_chunk;

   if (state->total_len_delivered) {
      return 0;
   }

   if (state->len >= CHUNK_SIZE) {
      memcpy(chunk, state->p, CHUNK_SIZE);
      state->p += CHUNK_SIZE;
      state->len -= CHUNK_SIZE;
      return 1;
   }

   memcpy(chunk, state->p, state->len);
   chunk += state->len;
   space_in_chunk = CHUNK_SIZE - state->len;
   state->p += state->len;
   state->len = 0;

   if (!state->single_one_delivered) {
      *chunk++ = 0x80;
      space_in_chunk -= 1;
      state->single_one_delivered = 1;
   }

   if (space_in_chunk >= TOTAL_LEN_LEN) {
      const size_t left = space_in_chunk - TOTAL_LEN_LEN;
      size_t len = state->total_len;
      int i;
      memset(chunk, 0x00, left);
      chunk += left;

      chunk[7] = (uint8_t) (len << 3);
      len >>= 5;
      for (i = 6; i >= 0; i--) {
         chunk[i] = (uint8_t) len;
         len >>= 8;
      }
      state->total_len_delivered = 1;
   } else {
      memset(chunk, 0x00, space_in_chunk);
   }

   return 1;
}